

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabInstanceNewTerm(Fts5VocabCursor *pCsr)

{
  int iVar1;
  Fts5IndexIter *pFVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int nData;
  u8 *pData;
  long in_FS_OFFSET;
  int rc;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  pFVar2 = pCsr->pIter;
  if (pFVar2->bEof == '\0') {
    lVar5 = (ulong)*(ushort *)(pFVar2[4].iRowid + 4) * 0x80;
    lVar3 = *(long *)((long)pFVar2 + lVar5 + 200);
    nData = *(int *)((long)pFVar2 + lVar5 + 0xd0) + -1;
    pData = (u8 *)(lVar3 + 1);
    if (lVar3 == 0) {
      pData = (u8 *)0x0;
    }
    iVar1 = pCsr->nLeTerm;
    if (-1 < iVar1) {
      iVar4 = iVar1;
      if (nData < iVar1) {
        iVar4 = nData;
      }
      iVar4 = memcmp(pCsr->zLeTerm,pData,(long)iVar4);
      if ((iVar4 < 0) || (iVar1 < nData && iVar4 == 0)) {
        pCsr->bEof = 1;
      }
    }
    sqlite3Fts5BufferSet(&local_2c,&pCsr->term,nData,pData);
  }
  else {
    pCsr->bEof = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5VocabInstanceNewTerm(Fts5VocabCursor *pCsr){
  int rc = SQLITE_OK;

  if( sqlite3Fts5IterEof(pCsr->pIter) ){
    pCsr->bEof = 1;
  }else{
    const char *zTerm;
    int nTerm;
    zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
    if( pCsr->nLeTerm>=0 ){
      int nCmp = MIN(nTerm, pCsr->nLeTerm);
      int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
      if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
        pCsr->bEof = 1;
      }
    }

    sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
  }
  return rc;
}